

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwnsc.cpp
# Opt level: O3

void LoadScriptResources(ResourceManager *ResMan,string *NWNHome,string *InstallDir,bool Erf16,
                        int Compilerversion)

{
  StringVec KeyFiles;
  StringVec local_98;
  ModuleLoadParams local_78;
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.CampaignIDUsed.Data4[0] = '\0';
  local_78.CampaignIDUsed.Data4[1] = '\0';
  local_78.CampaignIDUsed.Data4[2] = '\0';
  local_78.CampaignIDUsed.Data4[3] = '\0';
  local_78.CampaignIDUsed.Data4[4] = '\0';
  local_78.CampaignIDUsed.Data4[5] = '\0';
  local_78.CampaignIDUsed.Data4[6] = '\0';
  local_78.CampaignIDUsed.Data4[7] = '\0';
  local_78.CustomSearchPath = (char *)0x0;
  local_78.CampaignID = (GUID *)0x0;
  local_78.CampaignIDUsed.Data1 = 0;
  local_78.CampaignIDUsed.Data2 = 0;
  local_78.CampaignIDUsed.Data3 = 0;
  local_78.KeyFiles = (StringVec *)0x0;
  local_78.CustomFirstChanceAccessors = (IResourceAccessor<NWN::ResRef32> **)0x0;
  local_78.NumCustomFirstChanceAccessors = 0;
  local_78.CustomLastChanceAccessors = (IResourceAccessor<NWN::ResRef32> **)0x0;
  local_78.NumCustomLastChanceAccessors = 0;
  local_78.CustomModuleSourcePath = (char *)0x0;
  local_78.SearchOrder = ModSearch_PrefDirectory;
  local_78._28_4_ = 0;
  local_78.ResManFlags = 3;
  if (Compilerversion < 0xae) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (char (*) [4])"xp3");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (char (*) [9])"xp2patch");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (char (*) [4])"xp2");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (char (*) [4])"xp1");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (char (*) [7])"chitin");
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[14]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (char (*) [14])"data/nwn_base");
  }
  local_78.ResManFlags = 0x13;
  local_78.KeyFiles = &local_98;
  ResourceManager::LoadScriptResources(ResMan,NWNHome,InstallDir,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void
LoadScriptResources(
        ResourceManager &ResMan,
        const std::string &NWNHome,
        const std::string &InstallDir,
        bool Erf16,
        int Compilerversion
)
/*++

Routine Description:

	This routine loads the game script data into the resource system.

Arguments:

	ResMan - Supplies the ResourceManager instance that is to load the module.

	NWNHome - Supplies the users NWN2 home directory (i.e. NWN2 Documents dir).

	InstallDir - Supplies the game installation directory.

	Erf16 - Supplies a Boolean value indicating true if 16-byte ERFs are to be
	        used (i.e. for NWN1-style modules), else false if 32-byte ERFs are
	        to be used (i.e. for NWN2-style modules).

	CustomModPath - Optionally supplies an override path to search for a module
	                file within, bypassing the standard module load heuristics.

Return Value:

	None.  On failure, an std::exception is raised.

Environment:

	User mode.

--*/
{
    ResourceManager::ModuleLoadParams LoadParams;
    ResourceManager::StringVec KeyFiles;

    ZeroMemory(&LoadParams, sizeof(LoadParams));

    LoadParams.SearchOrder = ResourceManager::ModSearch_PrefDirectory;
    LoadParams.ResManFlags = ResourceManager::ResManFlagNoGranny2;

    LoadParams.ResManFlags |= ResourceManager::ResManFlagErf16;

    if (Compilerversion >= 174) {
#ifdef _WINDOWS
		KeyFiles.push_back("data\\nwn_base");
#else
		KeyFiles.emplace_back("data/nwn_base");
#endif // _WINDOWS
    } else {
        KeyFiles.emplace_back("xp3");
        KeyFiles.emplace_back("xp2patch");
        KeyFiles.emplace_back("xp2");
        //KeyFiles.emplace_back("xp1patch");
        KeyFiles.emplace_back("xp1");
        KeyFiles.emplace_back("chitin");
    }

    LoadParams.KeyFiles = &KeyFiles;

    LoadParams.ResManFlags |= ResourceManager::ResManFlagBaseResourcesOnly;

    ResMan.LoadScriptResources(
            NWNHome,
            InstallDir,
            &LoadParams
    );
}